

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeStack.h
# Opt level: O3

BOOL __thiscall LargeStack<Js::StringCopyInfo>::Empty(LargeStack<Js::StringCopyInfo> *this)

{
  SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount> *this_00;
  SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  uint uVar2;
  Type *ppLVar3;
  
  ppLVar3 = SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::
            Head(&this->blockStack->
                  super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                );
  uVar2 = 0;
  if ((*ppLVar3)->index == 0) {
    this_00 = this->blockStack;
    pSVar1 = (SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount> *)
             (this_00->
             super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
             ).super_SListNodeBase<Memory::ArenaAllocator>.next;
    if ((pSVar1 == this_00) ||
       ((SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount> *)
        (pSVar1->
        super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next != this_00)) {
      SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::Head
                (&this_00->
                  super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                );
      SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::
      RemoveHead(&this_00->
                  super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                 ,this_00->allocator);
      uVar2 = (uint)((SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                      *)(this->blockStack->
                        super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                        ).super_SListNodeBase<Memory::ArenaAllocator>.next == this->blockStack);
    }
    else {
      uVar2 = 1;
    }
  }
  return uVar2;
}

Assistant:

BOOL Empty() {
        LargeStackBlock<T>* top=blockStack->Top();
        if (top->Empty()) {
            if (blockStack->HasOne()) {
                // Avoid popping the last empty block to reduce freelist overhead.
                return true;
            }

            blockStack->Pop();
            return blockStack->Empty();
        }
        else return false;
    }